

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

void __thiscall
embree::ISPCTriangleMesh::ISPCTriangleMesh
          (ISPCTriangleMesh *this,RTCDevice device,uint numTriangles,uint numVertices,
          bool hasNormals,bool hasTexcoords,uint numTimeSteps)

{
  RTCGeometry pRVar1;
  Vec3fa **ppVVar2;
  ulong uVar3;
  Vec3fa *pVVar4;
  Vec2f *pVVar5;
  ISPCTriangle *pIVar6;
  ulong uVar7;
  ulong uVar8;
  
  (this->geom).type = TRIANGLE_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  this->normals = (Vec3fa **)0x0;
  this->texcoords = (Vec2f *)0x0;
  this->triangles = (ISPCTriangle *)0x0;
  this->startTime = 0.0;
  this->endTime = 1.0;
  this->numTimeSteps = numTimeSteps;
  this->numVertices = numVertices;
  this->numTriangles = numTriangles;
  pRVar1 = (RTCGeometry)rtcNewGeometry(device,0);
  (this->geom).geometry = pRVar1;
  uVar7 = (ulong)numTimeSteps;
  ppVVar2 = (Vec3fa **)alignedUSMMalloc(uVar7 * 8,0x10,DEVICE_READ_ONLY);
  this->positions = ppVVar2;
  uVar3 = (ulong)numVertices;
  if (numTimeSteps != 0) {
    uVar8 = 0;
    do {
      pVVar4 = (Vec3fa *)alignedUSMMalloc(uVar3 << 4,0x10,DEVICE_READ_ONLY);
      this->positions[uVar8] = pVVar4;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (hasNormals) {
    ppVVar2 = (Vec3fa **)alignedUSMMalloc(uVar7 * 8,0x10,DEVICE_READ_ONLY);
    this->normals = ppVVar2;
    if (numTimeSteps != 0) {
      uVar8 = 0;
      do {
        pVVar4 = (Vec3fa *)alignedUSMMalloc(uVar3 << 4,0x10,DEVICE_READ_ONLY);
        this->normals[uVar8] = pVVar4;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  if (hasTexcoords) {
    pVVar5 = (Vec2f *)alignedUSMMalloc(uVar3 << 3,0x10,DEVICE_READ_ONLY);
    this->texcoords = pVVar5;
  }
  pIVar6 = (ISPCTriangle *)alignedUSMMalloc((ulong)numTriangles * 0xc,0x10,DEVICE_READ_ONLY);
  this->triangles = pIVar6;
  return;
}

Assistant:

ISPCTriangleMesh::ISPCTriangleMesh (RTCDevice device, unsigned int numTriangles, unsigned int numVertices, bool hasNormals, bool hasTexcoords, unsigned int numTimeSteps)
    : geom(TRIANGLE_MESH),
      positions(nullptr), normals(nullptr), texcoords(nullptr), triangles(nullptr), startTime(0.0f), endTime(1.0f),
      numTimeSteps(numTimeSteps), numVertices(numVertices), numTriangles(numTriangles)
  {
    assert(numTimeSteps);

    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_TRIANGLE);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
    for (size_t i=0; i<numTimeSteps; i++)
      positions[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);

    if (hasNormals) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
      for (size_t i=0; i<numTimeSteps; i++)
        normals[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);
    }

    if (hasTexcoords)
      texcoords = (Vec2f*) alignedUSMMalloc(sizeof(Vec2f)*numVertices);

    triangles = (ISPCTriangle*) alignedUSMMalloc(sizeof(ISPCTriangle)*numTriangles);
  }